

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

LocalFederateId __thiscall helics::CommonCore::getFederateId(CommonCore *this,string_view name)

{
  FederateState *pFVar1;
  BaseType BVar2;
  shared_handle feds;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_handle local_38;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(&local_38,&this->federates);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,&local_20,&local_59);
  pFVar1 = gmlc::containers::
           MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::find(local_38.data,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (pFVar1 == (FederateState *)0x0) {
    BVar2 = -2000000000;
  }
  else {
    BVar2 = (pFVar1->local_id).fid;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_38.m_handle_lock);
  return (LocalFederateId)BVar2;
}

Assistant:

LocalFederateId CommonCore::getFederateId(std::string_view name) const
{
    auto feds = federates.lock();
    auto* fed = feds->find(std::string(name));
    if (fed != nullptr) {
        return fed->local_id;
    }

    return {};
}